

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

void shk_chat(monst *shkp)

{
  uint uVar1;
  boolean bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  long total;
  long shkmoney;
  eshk *eshk;
  monst *shkp_local;
  
  if ((*(uint *)&shkp->field_0x60 >> 0x19 & 1) == 0) {
    pcVar5 = Monnam(shkp);
    pline("%s asks whether you\'ve seen any untended shops recently.",pcVar5);
  }
  else if ((*(uint *)&shkp->field_0x60 >> 0x16 & 1) == 0) {
    pcVar5 = shkname(shkp);
    iVar3 = pronoun_gender(level,shkp);
    iVar4._0_1_ = shkp[0x1b].mtame;
    iVar4._1_1_ = shkp[0x1b].m_ap_type;
    iVar4._2_1_ = shkp[0x1b].mfrozen;
    iVar4._3_1_ = shkp[0x1b].mblinded;
    pcVar8 = "rude";
    if (iVar4 != 0) {
      pcVar8 = "non-paying";
    }
    pline("%s mentions how much %s dislikes %s customers.",pcVar5,genders[iVar3].he,pcVar8);
  }
  else if (*(char *)((long)&shkp[0x1b].meating + 1) == '\0') {
    if (*(short *)((long)&shkp[0x1b].misc_worn_check + 2) == 0) {
      if (*(int *)&shkp[0x1b].field_0x60 == 0) {
        if (shkp[0x1b].mappearance == 0) {
          iVar3._0_1_ = shkp[0x1b].mtame;
          iVar3._1_1_ = shkp[0x1b].m_ap_type;
          iVar3._2_1_ = shkp[0x1b].mfrozen;
          iVar3._3_1_ = shkp[0x1b].mblinded;
          if (iVar3 == 0) {
            lVar6 = money_cnt(shkp->minvent);
            if (lVar6 < 0x32) {
              pcVar5 = shkname(shkp);
              pline("%s complains that business is bad.",pcVar5);
            }
            else if (lVar6 < 0xfa1) {
              pcVar5 = shkname(shkp);
              iVar4 = strcmp(pcVar5,"Izchak");
              if (iVar4 == 0) {
                iVar4 = rn2(9);
                pcVar5 = Izchak_speaks[iVar4];
                pcVar8 = shkname(shkp);
                pline(pcVar5,pcVar8);
              }
              else if (((urole.malenum == 0x159) && (iVar4 = inhishop(shkp), iVar4 != 0)) &&
                      (bVar2 = shk_has_leather_jackets(shkp), bVar2 != '\0')) {
                pcVar5 = shkname(shkp);
                pline("%s says that he\'s selling these fine leather jackets.",pcVar5);
              }
              else {
                pcVar5 = shkname(shkp);
                pline("%s talks about the problem of shoplifters.",pcVar5);
              }
            }
            else {
              pcVar5 = shkname(shkp);
              pline("%s says that business is good.",pcVar5);
            }
          }
          else {
            pcVar5 = shkname(shkp);
            pline("%s complains about a recent robbery.",pcVar5);
          }
        }
        else {
          pcVar5 = shkname(shkp);
          uVar1 = shkp[0x1b].mappearance;
          pcVar8 = currency((long)(int)shkp[0x1b].mappearance);
          pline("%s encourages you to use your %ld %s of credit.",pcVar5,(ulong)uVar1,pcVar8);
        }
      }
      else {
        pcVar8 = shkname(shkp);
        iVar4 = pronoun_gender(level,shkp);
        pcVar5 = genders[iVar4].him;
        uVar1 = *(uint *)&shkp[0x1b].field_0x60;
        pcVar7 = currency((long)*(int *)&shkp[0x1b].field_0x60);
        pline("%s reminds you that you owe %s %ld %s.",pcVar8,pcVar5,(ulong)uVar1,pcVar7);
      }
    }
    else {
      lVar6 = addupbill(shkp);
      lVar6 = lVar6 + *(int *)&shkp[0x1b].field_0x60;
      pcVar5 = shkname(shkp);
      pcVar8 = currency(lVar6);
      pline("%s says that your bill comes to %ld %s.",pcVar5,lVar6,pcVar8);
    }
  }
  else {
    iVar4 = strncmp(&shkp[0x1b].field_0x75,plname,0x20);
    if (iVar4 == 0) {
      pcVar5 = Hello(shkp);
      verbalize("%s %s!  Didn\'t you forget to pay?",pcVar5,plname);
    }
    else {
      pcVar5 = Hello(shkp);
      verbalize("%s %s!  I was looking for %s.",pcVar5,plname,&shkp[0x1b].field_0x75);
      *(undefined1 *)((long)&shkp[0x1b].meating + 1) = 0;
    }
  }
  return;
}

Assistant:

void shk_chat(struct monst *shkp)
{
	struct eshk *eshk;
	long shkmoney;
	if (!shkp->isshk) {
		/* The monster type is shopkeeper, but this monster is
		   not actually a shk, which could happen if someone
		   wishes for a shopkeeper statue and then animates it.
		   (Note: shkname() would be "" in a case like this.) */
		pline("%s asks whether you've seen any untended shops recently.",
		      Monnam(shkp));
		/* [Perhaps we ought to check whether this conversation
		   is taking place inside an untended shop, but a shopless
		   shk can probably be expected to be rather disoriented.] */
		return;
	}

	eshk = ESHK(shkp);
	if (ANGRY(shkp))
		pline("%s mentions how much %s dislikes %s customers.",
			shkname(shkp), mhe(level, shkp),
			eshk->robbed ? "non-paying" : "rude");
	else if (eshk->following) {
		if (strncmp(eshk->customer, plname, PL_NSIZ)) {
		    verbalize("%s %s!  I was looking for %s.",
			    Hello(shkp), plname, eshk->customer);
		    eshk->following = 0;
		} else {
		    verbalize("%s %s!  Didn't you forget to pay?",
			      Hello(shkp), plname);
		}
	} else if (eshk->billct) {
		long total = addupbill(shkp) + eshk->debit;
		pline("%s says that your bill comes to %ld %s.",
		      shkname(shkp), total, currency(total));
	} else if (eshk->debit)
		pline("%s reminds you that you owe %s %ld %s.",
		      shkname(shkp), mhim(level, shkp),
		      eshk->debit, currency(eshk->debit));
	else if (eshk->credit)
		pline("%s encourages you to use your %ld %s of credit.",
		      shkname(shkp), eshk->credit, currency(eshk->credit));
	else if (eshk->robbed)
		pline("%s complains about a recent robbery.", shkname(shkp));
	else if ((shkmoney = money_cnt(shkp->minvent)) < 50)
		pline("%s complains that business is bad.", shkname(shkp));
	else if (shkmoney > 4000)
		pline("%s says that business is good.", shkname(shkp));
	else if (strcmp(shkname(shkp), "Izchak") == 0)
		pline(Izchak_speaks[rn2(SIZE(Izchak_speaks))],shkname(shkp));
	else if (Role_if(PM_ARCHEOLOGIST) && inhishop(shkp) &&
		 shk_has_leather_jackets(shkp))
		pline("%s says that he's selling these fine leather jackets.",
		      shkname(shkp));
	else
		pline("%s talks about the problem of shoplifters.",shkname(shkp));
}